

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O3

void av1_nn_propagate_4to1_sse3(float *inputs,float *weights,__m128 *output)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar4 = *weights * *inputs + weights[1] * inputs[1];
  fVar5 = weights[2] * inputs[2] + weights[3] * inputs[3];
  fVar6 = *weights * *inputs + weights[1] * inputs[1];
  fVar7 = weights[2] * inputs[2] + weights[3] * inputs[3];
  fVar1 = (*output)[1];
  fVar2 = (*output)[2];
  fVar3 = (*output)[3];
  (*output)[0] = fVar4 + fVar5 + (*output)[0];
  (*output)[1] = fVar6 + fVar7 + fVar1;
  (*output)[2] = fVar4 + fVar5 + fVar2;
  (*output)[3] = fVar6 + fVar7 + fVar3;
  return;
}

Assistant:

void av1_nn_propagate_4to1_sse3(const float *const inputs,
                                const float *const weights,
                                __m128 *const output) {
  const __m128 inputs128 = _mm_loadu_ps(inputs);

  const __m128 weights128 = _mm_loadu_ps(weights);

  const __m128 mul = _mm_mul_ps(inputs128, weights128);
  // [3 2 1 0] (weight and input indices)

  const __m128 hadd1 = _mm_hadd_ps(mul, mul);
  // [3+2 1+0 3+2 1+0]
  const __m128 hadd2 = _mm_hadd_ps(hadd1, hadd1);
  // [3+2+1+0 3+2+1+0 3+2+1+0 3+2+1+0]
  *output = _mm_add_ps(*output, hadd2);
}